

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  char cVar2;
  uint64_t uVar3;
  GCproto *pt_00;
  char *pcVar4;
  long *plVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  MSize MVar11;
  MSize i;
  uint32_t v;
  ulong uVar12;
  uint uVar13;
  cTValue *pcVar14;
  long lVar15;
  uint local_4c;
  
  if (((pt->flags & 1) != 0) && (uVar13 = pt->sizekgc, (ulong)uVar13 != 0)) {
    uVar3 = (pt->k).ptr64;
    lVar15 = 0;
    do {
      pt_00 = *(GCproto **)((uVar3 - 8) + lVar15 * 8);
      if (pt_00->gct == '\a') {
        bcwrite_proto(ctx,pt_00);
      }
      lVar15 = lVar15 + -1;
    } while (-lVar15 != (ulong)uVar13);
  }
  MVar11 = (uint)pt->sizeuv * 2 + pt->sizebc * 4 + 0x23;
  pcVar4 = (ctx->sb).b;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < MVar11) {
    pcVar4 = lj_buf_need2(&ctx->sb,MVar11);
  }
  pcVar4[5] = pt->flags & 7;
  pcVar4[6] = pt->numparams;
  pcVar4[7] = pt->framesize;
  pcVar4[8] = pt->sizeuv;
  pcVar4 = lj_strfmt_wuleb128(pcVar4 + 9,pt->sizekgc);
  pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->sizekn);
  pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->sizebc - 1);
  if (ctx->strip == 0) {
    uVar3 = (pt->lineinfo).ptr64;
    local_4c = 0;
    if (uVar3 != 0) {
      local_4c = ((int)pt - (int)uVar3) + pt->sizept;
    }
    pcVar4 = lj_strfmt_wuleb128(pcVar4,local_4c);
    if (local_4c == 0) goto LAB_0012435b;
    pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->firstline);
    pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->numline);
  }
  else {
LAB_0012435b:
    local_4c = 0;
  }
  MVar11 = pt->sizebc;
  uVar10 = (ulong)(MVar11 * 4 - 4);
  memcpy(pcVar4,(void *)((long)&pt[1].nextgc.gcptr64 + 4),uVar10);
  if ((pt->flags & 0x10) == 0) {
    if (MVar11 == 1 || pt->trace == 0) goto LAB_00124448;
  }
  else if (MVar11 == 1) goto LAB_00124448;
  lVar15 = *(long *)(((ctx->sb).L.ptr64 & 0xfffffffffffffff8) + 0x10);
  lVar6 = 0;
  do {
    uVar13 = (byte)pcVar4[lVar6 * 4] - 0x4e;
    if (uVar13 < 10) {
      if ((0x125U >> (uVar13 & 0x1f) & 1) == 0) {
        if ((0x248U >> (uVar13 & 0x1f) & 1) != 0) {
          *(undefined4 *)(pcVar4 + lVar6 * 4) =
               *(undefined4 *)
                (*(long *)(*(long *)(lVar15 + 0x460) +
                          (ulong)*(ushort *)(pcVar4 + lVar6 * 4 + 2) * 8) + 0x50);
        }
      }
      else {
        pcVar4[lVar6 * 4] = pcVar4[lVar6 * 4] - 1;
      }
    }
    lVar6 = lVar6 + 1;
  } while (MVar11 - 1 != (int)lVar6);
LAB_00124448:
  uVar12 = (ulong)((uint)pt->sizeuv * 2);
  memcpy(pcVar4 + uVar10,(void *)(pt->uv).ptr64,uVar12);
  (ctx->sb).w = pcVar4 + uVar10 + uVar12;
  uVar13 = pt->sizekgc;
  if ((ulong)uVar13 != 0) {
    plVar5 = (long *)((pt->k).ptr64 + (ulong)uVar13 * -8);
    uVar7 = 0;
    do {
      lVar15 = *plVar5;
      cVar2 = *(char *)(lVar15 + 9);
      if (cVar2 == '\n') {
        MVar11 = 0x15;
        if (*(short *)(lVar15 + 10) == 0xb) {
          uVar9 = 2;
        }
        else if (*(short *)(lVar15 + 10) == 0xc) {
          uVar9 = 3;
        }
        else {
          uVar9 = 4;
        }
      }
      else {
        uVar9 = 0;
        MVar11 = 1;
        if (cVar2 != '\a') {
          if (cVar2 == '\x04') {
            uVar9 = *(int *)(lVar15 + 0x14) + 5;
            MVar11 = uVar9;
          }
          else {
            MVar11 = 0xb;
            uVar9 = 1;
          }
        }
      }
      pcVar4 = (ctx->sb).w;
      if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < MVar11) {
        pcVar4 = lj_buf_more2(&ctx->sb,MVar11);
      }
      pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar9);
      if (uVar9 < 5) {
        if (uVar9 == 0) goto LAB_001245a9;
        if (uVar9 != 1) {
          pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar15 + 0x10));
          pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar15 + 0x14));
          if (uVar9 == 4) {
            pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar15 + 0x18));
            pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar15 + 0x1c));
          }
          goto LAB_001245a9;
        }
        v = 0;
        uVar10 = 0;
        if ((ulong)*(uint *)(lVar15 + 0x30) != 0) {
          uVar12 = (ulong)*(uint *)(lVar15 + 0x30);
          do {
            uVar10 = uVar12;
            if ((long)uVar10 < 1) {
              uVar10 = 0;
              break;
            }
            uVar12 = uVar10 - 1;
          } while (*(long *)(*(long *)(lVar15 + 0x10) + -8 + uVar10 * 8) == -1);
        }
        iVar8 = *(int *)(lVar15 + 0x34);
        if (iVar8 != 0) {
          lVar6 = 0;
          v = 0;
          do {
            v = v + (*(long *)(*(long *)(lVar15 + 0x28) + lVar6) != -1);
            lVar6 = lVar6 + 0x18;
          } while ((ulong)(iVar8 + 1 + (uint)(iVar8 == -1)) * 0x18 != lVar6);
        }
        pcVar4 = lj_strfmt_wuleb128(pcVar4,(uint32_t)uVar10);
        pcVar4 = lj_strfmt_wuleb128(pcVar4,v);
        (ctx->sb).w = pcVar4;
        if ((uint32_t)uVar10 != 0) {
          pcVar14 = *(cTValue **)(lVar15 + 0x10);
          do {
            bcwrite_ktabk(ctx,pcVar14,1);
            pcVar14 = pcVar14 + 1;
            uVar9 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar9;
          } while (uVar9 != 0);
        }
        if (v != 0) {
          pcVar14 = (cTValue *)((ulong)*(uint *)(lVar15 + 0x34) * 0x18 + *(long *)(lVar15 + 0x28));
          do {
            if (pcVar14->u64 != 0xffffffffffffffff) {
              bcwrite_ktabk(ctx,pcVar14 + 1,0);
              bcwrite_ktabk(ctx,pcVar14,1);
              v = v - 1;
              if (v == 0) break;
            }
            pcVar14 = pcVar14 + -3;
          } while( true );
        }
      }
      else {
        uVar9 = *(uint *)(lVar15 + 0x14);
        memcpy(pcVar4,(void *)(lVar15 + 0x18),(ulong)uVar9);
        pcVar4 = pcVar4 + uVar9;
LAB_001245a9:
        (ctx->sb).w = pcVar4;
      }
      uVar7 = uVar7 + 1;
      plVar5 = plVar5 + 1;
    } while (uVar7 != uVar13);
  }
  MVar11 = pt->sizekn;
  uVar3 = (pt->k).ptr64;
  pcVar4 = (ctx->sb).w;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < MVar11 * 10) {
    pcVar4 = lj_buf_more2(&ctx->sb,MVar11 * 10);
  }
  if (MVar11 != 0) {
    lVar15 = 0;
    do {
      dVar1 = *(double *)(uVar3 + lVar15 * 8);
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
        uVar13 = *(uint *)(uVar3 + lVar15 * 8);
        pcVar4 = lj_strfmt_wuleb128(pcVar4,(uVar13 & 0x80000000 | uVar13 * 2) + 1);
        iVar8 = *(int *)(uVar3 + lVar15 * 8);
        if (iVar8 < 0) {
          pcVar4[-1] = (byte)((uint)iVar8 >> 0x1b) & 0x18 | pcVar4[-1] & 7U;
        }
        pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(uVar3 + 4 + lVar15 * 8));
      }
      else {
        uVar13 = (uint)dVar1;
        pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar13 & 0x80000000 | uVar13 * 2);
        if ((int)uVar13 < 0) {
          pcVar4[-1] = (byte)(uVar13 >> 0x1b) & 0x18 | pcVar4[-1] & 7U;
        }
      }
      lVar15 = lVar15 + 1;
    } while (MVar11 != (MSize)lVar15);
  }
  (ctx->sb).w = pcVar4;
  if (local_4c != 0) {
    if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < local_4c) {
      pcVar4 = lj_buf_more2(&ctx->sb,local_4c);
    }
    memcpy(pcVar4,(void *)(pt->lineinfo).ptr64,(ulong)local_4c);
    (ctx->sb).w = pcVar4 + local_4c;
  }
  if (ctx->status == 0) {
    pcVar4 = (ctx->sb).b;
    iVar8 = *(int *)&(ctx->sb).w - (int)pcVar4;
    uVar13 = iVar8 - 5;
    uVar7 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    pcVar4 = pcVar4 + (5 - ((uVar7 ^ 0xffffffe0) * 9 + 0x168 >> 6));
    lj_strfmt_wuleb128(pcVar4,uVar13);
    iVar8 = (*ctx->wfunc)((lua_State *)((ctx->sb).L.ptr64 & 0xfffffffffffffff8),pcVar4,
                          (long)iVar8 + 0xfffffffb,ctx->wdata);
    ctx->status = iVar8;
  }
  return;
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  ctx->sb.w = p;

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    ctx->sb.w = p;
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = ctx->sb.b + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == ctx->sb.b + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}